

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsu.c
# Opt level: O3

UINT8 device_start_vsu(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  uint uVar1;
  uint uVar2;
  DEV_DATA DVar3;
  ulong uVar4;
  
  DVar3.chipInf = calloc(1,0x210);
  if ((DEV_DATA *)DVar3.chipInf == (DEV_DATA *)0x0) {
    return 0xff;
  }
  uVar1 = cfg->clock;
  *(uint *)&((DEV_DATA *)((long)DVar3.chipInf + 0x1f0))->chipInf = uVar1;
  uVar4 = (ulong)uVar1 / 0x78;
  *(uint *)((long)DVar3.chipInf + 500) = uVar1 / 0x78;
  if (cfg->srMode == '\x02') {
    uVar2 = cfg->smplRate;
    if (uVar2 <= uVar1 / 0x78) goto LAB_0016efdc;
  }
  else {
    if (cfg->srMode != '\x01') goto LAB_0016efdc;
    uVar2 = cfg->smplRate;
  }
  *(uint *)((long)DVar3.chipInf + 500) = uVar2;
  uVar4 = (ulong)uVar2;
LAB_0016efdc:
  ((DEV_DATA *)((long)DVar3.chipInf + 0x1f8))->chipInf =
       (void *)((uVar4 >> 1 | (ulong)uVar1 << 0x20) / uVar4);
  *(void **)DVar3.chipInf = DVar3.chipInf;
  retDevInf->dataPtr = (DEV_DATA *)DVar3.chipInf;
  retDevInf->sampleRate = (UINT32)uVar4;
  retDevInf->devDef = &devDef;
  retDevInf->linkDevCount = 0;
  retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
  return '\0';
}

Assistant:

static UINT8 device_start_vsu(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	vsu_state* chip;
	
	chip = (vsu_state*)calloc(1, sizeof(vsu_state));
	if (chip == NULL)
		return 0xFF;
	
	chip->clock = cfg->clock;
	// sample rate according to https://github.com/emu-rs/rustual-boy/blob/master/rustual-boy-core/src/vsu/mod.rs
	// 20 MHz / 480 = 41.667 Hz, VGMs use 5 MHz / 120
	chip->smplrate = chip->clock / 120;
	SRATE_CUSTOM_HIGHEST(cfg->srMode, chip->smplrate, cfg->smplRate);
	
	RC_SET_RATIO(&chip->cycleCntr, cfg->clock, chip->smplrate);
	
	vsu_set_mute_mask(chip, 0x00);
	
	chip->_devData.chipInf = chip;
	INIT_DEVINF(retDevInf, &chip->_devData, chip->smplrate, &devDef);
	
	return 0x00;
}